

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_merge.c
# Opt level: O1

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,UWORD32 *pu4_top_pu_idx,UWORD32 *pu4_left_pu_idx,
                    WORD32 left_nbr_4x4_strd,pu_t *ps_pu,WORD32 part_mode,WORD32 part_idx,
                    WORD32 part_wd,WORD32 part_ht,WORD32 part_pos_x,WORD32 part_pos_y,
                    WORD32 single_mcl_flag,WORD32 lb_avail,WORD32 l_avail,WORD32 tr_avail,
                    WORD32 t_avail,WORD32 tl_avail)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined4 uVar9;
  slice_header_t *psVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  WORD8 WVar13;
  WORD8 WVar14;
  mv_t mVar15;
  mv_t mVar16;
  char cVar17;
  WORD8 WVar18;
  uint uVar19;
  uint uVar20;
  pu_t *ps_pu_1;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  pu_t *ppVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  pu_t *ps_pu_2;
  int iVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  mv_t as_mv_col [2];
  WORD32 avail_col_flag [2];
  pu_t as_pu_merge_list [5];
  mv_t local_b0;
  undefined4 uStack_ac;
  int local_a8 [3];
  WORD32 local_9c;
  long local_98;
  UWORD32 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  UWORD32 *local_38;
  
  psVar10 = ps_mv_ctxt->ps_slice_hdr;
  local_98 = 0x4f8;
  if (psVar10->i1_slice_type == '\x01') {
    local_98 = 0x378;
  }
  bVar3 = ps_mv_ctxt->ps_pps->i1_log2_parallel_merge_level;
  local_38 = pu4_left_pu_idx;
  ps_pu_1 = ps_mv_ctxt->ps_pic_pu + (int)pu4_left_pu_idx[(part_ht + -1 >> 2) * left_nbr_4x4_strd];
  uVar23 = 0;
  if (l_avail == 0) {
    bVar33 = false;
  }
  else {
    bVar33 = (ps_pu_1->field_0xe & 1) == 0;
  }
  iVar24 = part_pos_x >> (bVar3 & 0x1f);
  iVar1 = part_pos_x + -1;
  iVar32 = part_pos_y >> (bVar3 & 0x1f);
  uVar20 = *(uint *)&ps_pu->field_0xc;
  uVar28 = uVar20 >> 0x14 & 7;
  if (bVar33) {
    bVar34 = false;
    if ((((part_pos_y + part_ht + -1 >> (bVar3 & 0x1f) != iVar32 ||
           iVar1 >> (bVar3 & 0x1f) != iVar24) &&
         (bVar34 = bVar33, part_idx == 1 && single_mcl_flag == 0)) && ((uint)part_mode < 8)) &&
       ((0xc4U >> (part_mode & 0x1fU) & 1) != 0)) {
      bVar34 = false;
    }
    uVar23 = 0;
    bVar33 = false;
    if (bVar34) {
      uStack_80 = *(undefined8 *)&(ps_pu_1->mv).i1_l0_ref_idx;
      local_88._0_2_ = (ps_pu_1->mv).s_l0_mv.i2_mvx;
      local_88._2_2_ = (ps_pu_1->mv).s_l0_mv.i2_mvy;
      local_88._4_2_ = (ps_pu_1->mv).s_l1_mv.i2_mvx;
      local_88._6_2_ = (ps_pu_1->mv).s_l1_mv.i2_mvy;
      bVar33 = true;
      uVar23 = 1;
      if (uVar28 == 0) {
        mVar15 = (ps_pu_1->mv).s_l0_mv;
        mVar16 = (ps_pu_1->mv).s_l1_mv;
        WVar18 = (ps_pu_1->mv).i1_l1_ref_idx;
        WVar13 = (ps_pu_1->mv).i1_l0_ref_pic_buf_id;
        WVar14 = (ps_pu_1->mv).i1_l1_ref_pic_buf_id;
        (ps_pu->mv).i1_l0_ref_idx = (ps_pu_1->mv).i1_l0_ref_idx;
        (ps_pu->mv).i1_l1_ref_idx = WVar18;
        (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar13;
        (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar14;
        (ps_pu->mv).s_l0_mv = mVar15;
        (ps_pu->mv).s_l1_mv = mVar16;
        uStack_80._4_4_ = (uint)((ulong)uStack_80 >> 0x20);
        *(uint *)&ps_pu->field_0xc = uVar20 & 0xfff9ffff | uStack_80._4_4_ & 0x60000;
        return;
      }
    }
  }
  ps_pu_2 = ps_mv_ctxt->ps_pic_pu + (int)pu4_top_pu_idx[part_wd + -1 >> 2];
  if (t_avail == 0) {
    bVar34 = false;
  }
  else {
    bVar34 = (ps_pu_2->field_0xe & 1) == 0;
  }
  iVar2 = part_pos_y + -1;
  bVar35 = true;
  uVar27 = (uint)bVar34;
  uVar30 = uVar27;
  uVar29 = uVar23;
  local_9c = left_nbr_4x4_strd;
  local_90 = pu4_top_pu_idx;
  if (bVar34 != false) {
    uVar19 = 0;
    if (iVar2 >> (bVar3 & 0x1f) == iVar32 && part_pos_x + part_wd + -1 >> (bVar3 & 0x1f) == iVar24)
    {
      uVar30 = 0;
    }
    else if ((((part_idx != 1 || single_mcl_flag != 0) || (5 < (uint)part_mode)) ||
             (uVar30 = 0, (0x32U >> (part_mode & 0x1fU) & 1) == 0)) &&
            (uVar19 = uVar27, uVar30 = uVar27, bVar33)) {
      uVar29 = ihevcd_compare_pu_t(ps_pu_1,ps_pu_2);
      uVar19 = uVar29 ^ 1;
    }
    uVar29 = uVar19 + uVar23;
    if (uVar19 != 0) {
      uVar21 = (ulong)(uVar23 << 4);
      uVar12 = *(undefined8 *)&(ps_pu_2->mv).i1_l0_ref_idx;
      *(undefined8 *)((long)&local_88 + uVar21) = *(undefined8 *)&ps_pu_2->mv;
      *(undefined8 *)((long)&uStack_80 + uVar21) = uVar12;
      uVar27 = uVar23 + 1;
      bVar34 = uVar23 == uVar28;
      uVar23 = uVar27;
      if (bVar34) {
        mVar15 = (ps_pu_2->mv).s_l0_mv;
        mVar16 = (ps_pu_2->mv).s_l1_mv;
        WVar18 = (ps_pu_2->mv).i1_l1_ref_idx;
        WVar13 = (ps_pu_2->mv).i1_l0_ref_pic_buf_id;
        WVar14 = (ps_pu_2->mv).i1_l1_ref_pic_buf_id;
        (ps_pu->mv).i1_l0_ref_idx = (ps_pu_2->mv).i1_l0_ref_idx;
        (ps_pu->mv).i1_l1_ref_idx = WVar18;
        (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar13;
        (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar14;
        (ps_pu->mv).s_l0_mv = mVar15;
        (ps_pu->mv).s_l1_mv = mVar16;
        *(uint *)&ps_pu->field_0xc =
             uVar20 & 0xfff9ffff | *(uint *)((long)&uStack_80 + uVar21 + 4) & 0x60000;
        bVar35 = false;
      }
    }
  }
  if (bVar35) {
    ppVar26 = ps_mv_ctxt->ps_pic_pu + (int)local_90[part_wd >> 2];
    if (tr_avail == 0) {
      bVar34 = false;
    }
    else {
      bVar34 = (ppVar26->field_0xe & 1) == 0;
    }
    bVar35 = true;
    if (bVar34 != false) {
      uVar20 = 0;
      if (iVar2 >> (bVar3 & 0x1f) != iVar32 || part_pos_x + part_wd >> (bVar3 & 0x1f) != iVar24) {
        if (uVar30 == 0) {
          uVar20 = (uint)bVar34;
        }
        else {
          uVar20 = ihevcd_compare_pu_t(ps_pu_2,ppVar26);
          uVar20 = uVar20 ^ 1;
        }
      }
      uVar29 = uVar29 + uVar20;
      if (uVar20 != 0) {
        uVar21 = (ulong)(uVar23 << 4);
        uVar12 = *(undefined8 *)&(ppVar26->mv).i1_l0_ref_idx;
        *(undefined8 *)((long)&local_88 + uVar21) = *(undefined8 *)&ppVar26->mv;
        *(undefined8 *)((long)&uStack_80 + uVar21) = uVar12;
        uVar20 = uVar23 + 1;
        bVar34 = uVar23 == uVar28;
        uVar23 = uVar20;
        if (bVar34) {
          mVar15 = (ppVar26->mv).s_l0_mv;
          mVar16 = (ppVar26->mv).s_l1_mv;
          WVar18 = (ppVar26->mv).i1_l1_ref_idx;
          WVar13 = (ppVar26->mv).i1_l0_ref_pic_buf_id;
          WVar14 = (ppVar26->mv).i1_l1_ref_pic_buf_id;
          (ps_pu->mv).i1_l0_ref_idx = (ppVar26->mv).i1_l0_ref_idx;
          (ps_pu->mv).i1_l1_ref_idx = WVar18;
          (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar13;
          (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar14;
          (ps_pu->mv).s_l0_mv = mVar15;
          (ps_pu->mv).s_l1_mv = mVar16;
          *(uint *)&ps_pu->field_0xc =
               *(uint *)&ps_pu->field_0xc & 0xfff9ffff |
               *(uint *)((long)&uStack_80 + uVar21 + 4) & 0x60000;
          bVar35 = false;
        }
      }
    }
    if (bVar35) {
      ppVar26 = ps_mv_ctxt->ps_pic_pu + (int)local_38[(part_ht >> 2) * local_9c];
      if (lb_avail == 0) {
        bVar34 = false;
      }
      else {
        bVar34 = (ppVar26->field_0xe & 1) == 0;
      }
      bVar35 = true;
      if (bVar34 != false) {
        uVar20 = 0;
        if (part_pos_y + part_ht >> (bVar3 & 0x1f) != iVar32 || iVar1 >> (bVar3 & 0x1f) != iVar24) {
          if (bVar33) {
            uVar20 = ihevcd_compare_pu_t(ps_pu_1,ppVar26);
            uVar20 = uVar20 ^ 1;
          }
          else {
            uVar20 = (uint)bVar34;
          }
        }
        uVar29 = uVar29 + uVar20;
        if (uVar20 != 0) {
          uVar21 = (ulong)(uVar23 << 4);
          uVar12 = *(undefined8 *)&(ppVar26->mv).i1_l0_ref_idx;
          *(undefined8 *)((long)&local_88 + uVar21) = *(undefined8 *)&ppVar26->mv;
          *(undefined8 *)((long)&uStack_80 + uVar21) = uVar12;
          uVar20 = uVar23 + 1;
          bVar34 = uVar23 == uVar28;
          uVar23 = uVar20;
          if (bVar34) {
            mVar15 = (ppVar26->mv).s_l0_mv;
            mVar16 = (ppVar26->mv).s_l1_mv;
            WVar18 = (ppVar26->mv).i1_l1_ref_idx;
            WVar13 = (ppVar26->mv).i1_l0_ref_pic_buf_id;
            WVar14 = (ppVar26->mv).i1_l1_ref_pic_buf_id;
            (ps_pu->mv).i1_l0_ref_idx = (ppVar26->mv).i1_l0_ref_idx;
            (ps_pu->mv).i1_l1_ref_idx = WVar18;
            (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar13;
            (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar14;
            (ps_pu->mv).s_l0_mv = mVar15;
            (ps_pu->mv).s_l1_mv = mVar16;
            *(uint *)&ps_pu->field_0xc =
                 *(uint *)&ps_pu->field_0xc & 0xfff9ffff |
                 *(uint *)((long)&uStack_80 + uVar21 + 4) & 0x60000;
            bVar35 = false;
          }
        }
      }
      if (bVar35) {
        ppVar26 = ps_mv_ctxt->ps_pic_pu + (int)local_90[-1];
        if (tl_avail == 0) {
          bVar34 = false;
        }
        else {
          bVar34 = (ppVar26->field_0xe & 1) == 0;
        }
        bVar35 = true;
        if (bVar34 != false) {
          uVar20 = 0 >> (bVar3 & 0x1f);
          if ((iVar32 != iVar2 >> (bVar3 & 0x1f) || iVar24 != iVar1 >> (bVar3 & 0x1f)) &&
             (uVar29 != 4)) {
            if (bVar33) {
              uVar20 = ihevcd_compare_pu_t(ps_pu_1,ppVar26);
              uVar20 = uVar20 ^ 1;
            }
            else {
              uVar20 = (uint)bVar34;
            }
            if ((uVar30 != 0) && (uVar20 != 0)) {
              uVar20 = ihevcd_compare_pu_t(ps_pu_2,ppVar26);
              uVar20 = uVar20 ^ 1;
            }
          }
          if (uVar20 != 0) {
            uVar21 = (ulong)(uVar23 << 4);
            uVar12 = *(undefined8 *)&(ppVar26->mv).i1_l0_ref_idx;
            *(undefined8 *)((long)&local_88 + uVar21) = *(undefined8 *)&ppVar26->mv;
            *(undefined8 *)((long)&uStack_80 + uVar21) = uVar12;
            uVar20 = uVar23 + 1;
            bVar33 = uVar23 == uVar28;
            uVar23 = uVar20;
            if (bVar33) {
              mVar15 = (ppVar26->mv).s_l0_mv;
              mVar16 = (ppVar26->mv).s_l1_mv;
              WVar18 = (ppVar26->mv).i1_l1_ref_idx;
              WVar13 = (ppVar26->mv).i1_l0_ref_pic_buf_id;
              WVar14 = (ppVar26->mv).i1_l1_ref_pic_buf_id;
              (ps_pu->mv).i1_l0_ref_idx = (ppVar26->mv).i1_l0_ref_idx;
              (ps_pu->mv).i1_l1_ref_idx = WVar18;
              (ps_pu->mv).i1_l0_ref_pic_buf_id = WVar13;
              (ps_pu->mv).i1_l1_ref_pic_buf_id = WVar14;
              (ps_pu->mv).s_l0_mv = mVar15;
              (ps_pu->mv).s_l1_mv = mVar16;
              *(uint *)&ps_pu->field_0xc =
                   *(uint *)&ps_pu->field_0xc & 0xfff9ffff |
                   *(uint *)((long)&uStack_80 + uVar21 + 4) & 0x60000;
              bVar35 = false;
            }
          }
        }
        if (bVar35) {
          local_a8[0] = 0;
          local_a8[1] = 0;
          ihevcd_collocated_mvp
                    (ps_mv_ctxt,ps_pu,&local_b0,local_a8,0,part_pos_x + part_wd,part_pos_y + part_ht
                    );
          iVar1 = local_a8[0];
          iVar24 = local_a8[1];
          if (local_a8[0] != 0 || local_a8[1] != 0) {
            *(ulong *)((long)&local_88 + (ulong)(uVar23 << 4)) = CONCAT44(uStack_ac,local_b0);
          }
          bVar33 = true;
          if (local_a8[1] == 0 || local_a8[0] == 0) {
            ihevcd_collocated_mvp
                      (ps_mv_ctxt,ps_pu,&local_b0,local_a8,0,(part_wd >> 1) + part_pos_x,
                       (part_ht >> 1) + part_pos_y);
            if (iVar1 == 0) {
              *(mv_t *)((long)&local_88 + (ulong)(uVar23 << 4)) = local_b0;
            }
            if (iVar24 == 0) {
              *(undefined4 *)((long)&local_88 + (ulong)(uVar23 << 4) + 4) = uStack_ac;
            }
            bVar33 = iVar1 != 0 || local_a8[0] != 0;
            local_a8[1] = iVar24 | local_a8[1];
          }
          uVar21 = (ulong)(uVar23 << 4);
          *(undefined2 *)((long)&uStack_80 + uVar21) = 0;
          uVar20 = 0x20000;
          if (bVar33 != false) {
            uVar20 = (uint)(local_a8[1] != 0U) << 0x12;
          }
          *(uint *)((long)&uStack_80 + uVar21 + 4) =
               *(uint *)((long)&uStack_80 + uVar21 + 4) & 0xfff9ffff | uVar20;
          uVar23 = (byte)(local_a8[1] != 0U | bVar33) + uVar23;
          if (uVar23 == uVar28 + 1) {
            uVar21 = (ulong)(uVar23 - 1);
            uVar9 = *(undefined4 *)(&uStack_80 + uVar21 * 2);
            (ps_pu->mv).i1_l0_ref_idx = (char)uVar9;
            (ps_pu->mv).i1_l1_ref_idx = (char)((uint)uVar9 >> 8);
            (ps_pu->mv).i1_l0_ref_pic_buf_id = (char)((uint)uVar9 >> 0x10);
            (ps_pu->mv).i1_l1_ref_pic_buf_id = (char)((uint)uVar9 >> 0x18);
            uVar9 = (undefined4)(&local_88)[uVar21 * 2];
            uVar11 = (undefined4)((ulong)(&local_88)[uVar21 * 2] >> 0x20);
            (ps_pu->mv).s_l0_mv.i2_mvx = (short)uVar9;
            (ps_pu->mv).s_l0_mv.i2_mvy = (short)((uint)uVar9 >> 0x10);
            (ps_pu->mv).s_l1_mv.i2_mvx = (short)uVar11;
            (ps_pu->mv).s_l1_mv.i2_mvy = (short)((uint)uVar11 >> 0x10);
            *(uint *)&ps_pu->field_0xc =
                 *(uint *)&ps_pu->field_0xc & 0xfff9ffff |
                 *(uint *)((long)&uStack_80 + uVar21 * 0x10 + 4) & 0x60000;
          }
          else {
            cVar4 = psVar10->i1_slice_type;
            if (uVar23 - 2 < 3 && cVar4 == '\0') {
              uVar20 = (uVar23 - 1) * uVar23;
              uVar25 = 0;
              uVar21 = (ulong)uVar20;
              if ((int)uVar20 < 1) {
                uVar21 = uVar25;
              }
              while (bVar33 = true, uVar21 * 4 != uVar25) {
                lVar22 = (long)*(int *)((long)&DAT_00171160 + uVar25);
                if (((*(uint *)((long)&uStack_80 + lVar22 * 0x10 + 4) & 0x60000) != 0x20000) &&
                   (lVar31 = (long)*(int *)((long)&DAT_00171190 + uVar25) * 0x10,
                   (*(byte *)((long)&uStack_80 + lVar31 + 6) & 6) != 0)) {
                  cVar5 = *(char *)(&uStack_80 + lVar22 * 2);
                  cVar17 = *(char *)((long)&uStack_80 + lVar31 + 1);
                  sVar6 = *(short *)((long)&local_88 + lVar22 * 0x10 + 2);
                  sVar7 = *(short *)((long)&local_88 + lVar31 + 4);
                  sVar8 = *(short *)((long)&local_88 + lVar31 + 6);
                  bVar34 = true;
                  if (((*(int *)((long)psVar10->as_ref_pic_list0[cVar5].pv_pic_buf + 0x10) !=
                        *(int *)(*(long *)((long)psVar10->ai4_poc_lsb_lt +
                                          (long)cVar17 * 0x18 + local_98 + -8) + 0x10)) ||
                      ((*(short *)(&local_88 + lVar22 * 2) != sVar7 || (sVar6 != sVar8)))) &&
                     (uVar29 = uVar23 + 1, bVar35 = uVar23 == uVar28, uVar23 = uVar29, bVar35)) {
                    (ps_pu->mv).s_l0_mv.i2_mvx = *(short *)(&local_88 + lVar22 * 2);
                    (ps_pu->mv).s_l0_mv.i2_mvy = sVar6;
                    (ps_pu->mv).s_l1_mv.i2_mvx = sVar7;
                    (ps_pu->mv).s_l1_mv.i2_mvy = sVar8;
                    (ps_pu->mv).i1_l0_ref_idx = cVar5;
                    (ps_pu->mv).i1_l1_ref_idx = cVar17;
                    *(uint *)&ps_pu->field_0xc = *(uint *)&ps_pu->field_0xc & 0xfff9ffff | 0x40000;
                    bVar34 = false;
                  }
                  if (!bVar34) {
                    bVar33 = false;
                    break;
                  }
                }
                if (((ulong)uVar20 * 4 - 4 == uVar25) || (uVar25 = uVar25 + 4, uVar23 == 5)) break;
              }
              if (!bVar33) {
                return;
              }
            }
            cVar5 = psVar10->i1_num_ref_idx_l0_active;
            cVar17 = cVar5;
            if ((cVar4 != '\x01') &&
               (cVar17 = psVar10->i1_num_ref_idx_l1_active,
               cVar5 < psVar10->i1_num_ref_idx_l1_active)) {
              cVar17 = cVar5;
            }
            WVar18 = '\0';
            if ((int)(uVar28 - uVar23) < (int)cVar17) {
              WVar18 = (WORD8)(uVar28 - uVar23);
            }
            (ps_pu->mv).i1_l0_ref_idx = WVar18;
            if (cVar4 == '\x01') {
              (ps_pu->mv).i1_l1_ref_idx = '\0';
              uVar23 = *(uint *)&ps_pu->field_0xc & 0xfff9ffff;
            }
            else {
              (ps_pu->mv).i1_l1_ref_idx = WVar18;
              uVar23 = *(uint *)&ps_pu->field_0xc & 0xfff9ffff | 0x40000;
            }
            *(uint *)&ps_pu->field_0xc = uVar23;
            (ps_pu->mv).s_l0_mv.i2_mvx = 0;
            (ps_pu->mv).s_l0_mv.i2_mvy = 0;
            (ps_pu->mv).s_l1_mv.i2_mvx = 0;
            (ps_pu->mv).s_l1_mv.i2_mvy = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,
                     UWORD32 *pu4_top_pu_idx,
                     UWORD32 *pu4_left_pu_idx,
                     WORD32 left_nbr_4x4_strd,
                     pu_t *ps_pu,
                     WORD32 part_mode,
                     WORD32 part_idx,
                     WORD32 part_wd,
                     WORD32 part_ht,
                     WORD32 part_pos_x,
                     WORD32 part_pos_y,
                     WORD32 single_mcl_flag,
                     WORD32 lb_avail,
                     WORD32 l_avail,
                     WORD32 tr_avail,
                     WORD32 t_avail,
                     WORD32 tl_avail)
{
    /******************************************************/
    /*      Spatial Merge Candidates                      */
    /******************************************************/
    slice_header_t *ps_slice_hdr;
    pu_t as_pu_merge_list[MAX_NUM_MERGE_CAND];
    pps_t *ps_pps;
    ref_list_t *ps_ref_list[2];
    WORD32 sum_avail_a0_a1_b0_b1 = 0; /*Sum of availability of A0, A1, B0, B1*/
    WORD32 nbr_x, nbr_y;
    WORD32 nbr_avail[MAX_NUM_MV_NBR];
    WORD32 merge_shift;
    WORD32 nbr_pu_idx;
    pu_t *ps_nbr_pu[MAX_NUM_MV_NBR];
    WORD32 max_num_merge_cand;
    WORD32 candidate_cnt;
    WORD32 pos_x_merge_shift, pos_y_merge_shift;

    ps_slice_hdr = ps_mv_ctxt->ps_slice_hdr;
    ps_pps = ps_mv_ctxt->ps_pps;
    /* Initializing reference list */
    ps_ref_list[0] = ps_slice_hdr->as_ref_pic_list0;
    ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list1;
    if(PSLICE == ps_slice_hdr->i1_slice_type)
        ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list0;

    candidate_cnt = 0;
    /*******************************************/
    /* Neighbor location: Graphical indication */
    /*                                         */
    /*          B2 _____________B1 B0          */
    /*            |               |            */
    /*            |               |            */
    /*            |               |            */
    /*            |      PU     ht|            */
    /*            |               |            */
    /*            |               |            */
    /*          A1|______wd_______|            */
    /*          A0                             */
    /*                                         */
    /*******************************************/

    merge_shift = ps_pps->i1_log2_parallel_merge_level;

    /* Availability check */
    /* A1 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht - 1; /* A1 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A1] = l_avail
                    && (!ps_nbr_pu[NBR_A1]->b1_intra_flag); /* A1 */

    pos_x_merge_shift = (part_pos_x >> merge_shift);
    pos_y_merge_shift = (part_pos_y >> merge_shift);
    max_num_merge_cand = ps_pu->b3_merge_idx + 1;

    {
        if(nbr_avail[NBR_A1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A1] = 0;
            }

            /* SPEC JCTVC-K1003_v9 version has a different way using not available       */
            /* candidates compared to software. for non square part and seconf part case */
            /* ideally nothing from the 1st partition should be used as per spec but     */
            /* HM 8.2 dev verison does not adhere to this. currenlty code fllows HM      */

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_Nx2N) || (part_mode == PART_nLx2N) ||
                                            (part_mode == PART_nRx2N)))
            {
                nbr_avail[NBR_A1] = 0;
            }
            sum_avail_a0_a1_b0_b1 += nbr_avail[NBR_A1];
            if(nbr_avail[NBR_A1])
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /* B1 */
    nbr_x = part_pos_x + part_wd - 1;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B1] = t_avail
                    && (!ps_nbr_pu[NBR_B1]->b1_intra_flag); /* B1 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B1];

        if(nbr_avail[NBR_B1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_2NxN) || (part_mode == PART_2NxnU) ||
                                            (part_mode == PART_2NxnD)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B1]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B0 */
    nbr_x = part_pos_x + part_wd;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B0] = tr_avail
                    && (!ps_nbr_pu[NBR_B0]->b1_intra_flag); /* B0 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B0];

        /* if at same merge level */
        if(nbr_avail[NBR_B0])
        {
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_B1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* A0 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht; /* A0 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A0] = lb_avail
                    && (!ps_nbr_pu[NBR_A0]->b1_intra_flag); /* A0 */
    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_A0];

        if(nbr_avail[NBR_A0])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_A0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B2 */

    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y - 1; /* B2 */

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B2] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B2] = tl_avail
                    && (!ps_nbr_pu[NBR_B2]->b1_intra_flag); /* B2 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B2];

        if(nbr_avail[NBR_B2])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B2] = 0;
                avail_flag = 0;
            }
            else if(4 == sum_avail_a0_a1_b0_b1)
            {
                avail_flag = 0;
            }

            else
            {
                if(nbr_avail[NBR_A1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B2]);
                }

                if(avail_flag && nbr_avail[NBR_B1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B2]);
                }
            }

            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B2];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /***********************************************************/
    /*          Collocated MV prediction                       */
    /***********************************************************/
    {
        mv_t as_mv_col[2];
        WORD32 avail_col_flag[2] = { 0 }, x_col, y_col;
        WORD32 avail_col_l0, avail_col_l1;
//        ihevcd_collocated_mvp(ps_mv_ctxt,ps_pu,part_pos_x,part_pos_y,part_wd,part_ht,as_mv_col,avail_col_flag,0);

        /* Checking Collocated MV availability at Bottom right of PU*/
        x_col = part_pos_x + part_wd;
        y_col = part_pos_y + part_ht;
        ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

        avail_col_l0 = avail_col_flag[0];
        avail_col_l1 = avail_col_flag[1];

        if(avail_col_l0 || avail_col_l1)
        {
            as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
        }

        if(avail_col_l0 == 0 || avail_col_l1 == 0)
        {
            /* Checking Collocated MV availability at Center of PU */
            x_col = part_pos_x + (part_wd >> 1);
            y_col = part_pos_y + (part_ht >> 1);
            ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

            if(avail_col_l0 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            }
            if(avail_col_l1 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
            }

            avail_col_l0 |= avail_col_flag[0];
            avail_col_l1 |= avail_col_flag[1];
        }

        as_pu_merge_list[candidate_cnt].mv.i1_l0_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].mv.i1_l1_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].b2_pred_mode = avail_col_l0 ? (avail_col_l1 ? PRED_BI : PRED_L0) : PRED_L1;

        candidate_cnt += (avail_col_l0 || avail_col_l1);

        if(candidate_cnt == max_num_merge_cand)
        {
            ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
            ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
            return;
        }

    }
    {
        WORD32 slice_type;

        slice_type = ps_slice_hdr->i1_slice_type;
        /* Colocated mv has to be added to list, if available */

        /******************************************************/
        /*      Bi pred merge candidates                      */
        /******************************************************/
        if(slice_type == BSLICE)
        {
            if((candidate_cnt > 1) && (candidate_cnt < MAX_NUM_MERGE_CAND))
            {
                WORD32 priority_list0[12] =
                    { 0, 1, 0, 2, 1, 2, 0, 3, 1, 3, 2, 3 };
                WORD32 priority_list1[12] =
                    { 1, 0, 2, 0, 2, 1, 3, 0, 3, 1, 3, 2 };
                WORD32 l0_cand, l1_cand;
                WORD32 bi_pred_idx = 0;
                WORD32 total_bi_pred_cand =
                                candidate_cnt * (candidate_cnt - 1);

                while(bi_pred_idx < total_bi_pred_cand)
                {
                    l0_cand = priority_list0[bi_pred_idx];
                    l1_cand = priority_list1[bi_pred_idx];

                    if((as_pu_merge_list[l0_cand].b2_pred_mode != PRED_L1)
                                    && (as_pu_merge_list[l1_cand].b2_pred_mode
                                                    != PRED_L0))
                    {
                        WORD8 i1_l0_ref_idx, i1_l1_ref_idx;
                        mv_t s_l0_mv, s_l1_mv;
                        pic_buf_t *ps_pic_buf_l0, *ps_pic_buf_l1;

                        i1_l0_ref_idx = as_pu_merge_list[l0_cand].mv.i1_l0_ref_idx;
                        i1_l1_ref_idx = as_pu_merge_list[l1_cand].mv.i1_l1_ref_idx;
                        ps_pic_buf_l0 = (pic_buf_t *)((ps_ref_list[0][i1_l0_ref_idx].pv_pic_buf));
                        ps_pic_buf_l1 = (pic_buf_t *)((ps_ref_list[1][i1_l1_ref_idx].pv_pic_buf));
                        s_l0_mv = as_pu_merge_list[l0_cand].mv.s_l0_mv;
                        s_l1_mv = as_pu_merge_list[l1_cand].mv.s_l1_mv;

                        if((ps_pic_buf_l0->i4_abs_poc != ps_pic_buf_l1->i4_abs_poc)
                                        || (s_l0_mv.i2_mvx != s_l1_mv.i2_mvx)
                                        || (s_l0_mv.i2_mvy != s_l1_mv.i2_mvy))
                        {
                            candidate_cnt++;
                            if(candidate_cnt == max_num_merge_cand)
                            {
                                ps_pu[0].mv.s_l0_mv = s_l0_mv;
                                ps_pu[0].mv.s_l1_mv = s_l1_mv;
                                ps_pu[0].mv.i1_l0_ref_idx = i1_l0_ref_idx;
                                ps_pu[0].mv.i1_l1_ref_idx = i1_l1_ref_idx;
                                ps_pu[0].b2_pred_mode = PRED_BI;
                                return;
                            }
                        }
                    }

                    bi_pred_idx++;

                    if((bi_pred_idx == total_bi_pred_cand)
                                    || (candidate_cnt == MAX_NUM_MERGE_CAND))
                    {
                        break;
                    }
                }
            }
        }

        /******************************************************/
        /*      Zero merge candidates                         */
        /******************************************************/
//        if(candidate_cnt < max_num_merge_cand)
        {
            WORD32 num_ref_idx;
            WORD32 zero_idx;

            zero_idx = max_num_merge_cand - candidate_cnt - 1;

            if(slice_type == PSLICE)
                num_ref_idx = ps_slice_hdr->i1_num_ref_idx_l0_active;
            else
                /* Slice type B */
                num_ref_idx = MIN(ps_slice_hdr->i1_num_ref_idx_l0_active, ps_slice_hdr->i1_num_ref_idx_l1_active);

            if(zero_idx >= num_ref_idx)
                zero_idx = 0;

            ps_pu[0].mv.i1_l0_ref_idx = zero_idx;
            if(slice_type == PSLICE)
            {
                ps_pu[0].mv.i1_l1_ref_idx = 0;
                ps_pu[0].b2_pred_mode = PRED_L0;
            }
            else /* Slice type B */
            {
                ps_pu[0].mv.i1_l1_ref_idx = zero_idx;
                ps_pu[0].b2_pred_mode = PRED_BI;
            }

            ps_pu[0].mv.s_l0_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l0_mv.i2_mvy = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvy = 0;

            candidate_cnt++;
        }
    }

    return;
}